

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O1

void __thiscall r_exec::PTPX::reduce(PTPX *this,View *input)

{
  list<r_exec::Input> *destination;
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  pointer pcVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  Code *pCVar7;
  BindingMap *this_00;
  long lVar8;
  undefined4 extraout_var;
  uint64_t uVar9;
  uint64_t uVar10;
  TimingGuardBuilder *this_01;
  _Fact *f_icst;
  undefined4 extraout_var_00;
  long *plVar11;
  Code *pCVar12;
  undefined4 extraout_var_01;
  long lVar13;
  TimingGuardBuilder *guard_builder;
  list<r_exec::Input> *s;
  TimingGuardBuilder *in_R8;
  uint64_t in_R9;
  uint16_t cause_index;
  Input cause;
  Code *new_cst;
  ushort local_82;
  Code *local_80;
  BindingMap *local_78;
  Code *local_70;
  uint64_t local_68;
  long *local_60;
  _Object *local_58;
  _Object *local_50;
  char local_48;
  uint64_t local_40;
  Code *local_38;
  
  destination = &(this->super__TPX).inputs;
  s = destination;
  AutoFocusController::copy_cross_buffer((this->super__TPX).super_TPX.auto_focus,destination);
  local_68 = (*Now)();
  pCVar7 = (Code *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact((Fact *)pCVar7,(Fact *)(this->f_imdl).object);
  _Fact::set_opposite((_Fact *)pCVar7);
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_80 = BindingMap::abstract_object(this_00,pCVar7,false);
  if (local_80 != (Code *)0x0) {
    LOCK();
    paVar1 = &(local_80->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  lVar8 = (this->super__TPX).inputs.used_cells_head;
  local_70 = pCVar7;
  local_78 = this_00;
  do {
    while( true ) {
      if (lVar8 == -1) {
        lVar8 = (this->super__TPX).inputs.used_cells_head;
        if (lVar8 == -1) {
          guard_builder = (TimingGuardBuilder *)0x0;
        }
        else {
          guard_builder = (TimingGuardBuilder *)0x0;
          do {
            p_Var2 = (destination->cells).
                     super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].data.input.object;
            iVar6 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar6));
            sVar5 = r_code::Atom::asOpcode();
            if (sVar5 != Opcodes::ICst) {
              pcVar3 = (destination->cells).
                       super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_60 = *(long **)&pcVar3[lVar8].data.bindings;
              if (local_60 != (long *)0x0) {
                LOCK();
                local_60[1] = local_60[1] + 1;
                UNLOCK();
              }
              local_58 = pcVar3[lVar8].data.abstraction.object;
              if (local_58 != (_Object *)0x0) {
                LOCK();
                (local_58->refCount).super___atomic_base<long>._M_i =
                     (local_58->refCount).super___atomic_base<long>._M_i + 1;
                UNLOCK();
              }
              local_50 = pcVar3[lVar8].data.input.object;
              if (local_50 != (_Object *)0x0) {
                LOCK();
                (local_50->refCount).super___atomic_base<long> =
                     (__atomic_base<long>)
                     (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i + 1);
                UNLOCK();
              }
              local_48 = pcVar3[lVar8].data.eligible_cause;
              local_40 = pcVar3[lVar8].data.ijt;
              if ((bool)local_48 == true) {
                uVar9 = _Fact::get_after((_Fact *)local_70);
                uVar10 = _Fact::get_after((_Fact *)local_50);
                this_01 = (TimingGuardBuilder *)operator_new(0x18);
                TimingGuardBuilder::TimingGuardBuilder(this_01,uVar9 - uVar10);
                if (guard_builder != this_01) {
                  if (guard_builder != (TimingGuardBuilder *)0x0) {
                    LOCK();
                    paVar1 = &(guard_builder->super_GuardBuilder).super__Object.refCount;
                    (paVar1->super___atomic_base<long>)._M_i =
                         (paVar1->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    if ((guard_builder->super_GuardBuilder).super__Object.refCount.
                        super___atomic_base<long>._M_i < 1) {
                      (*(guard_builder->super_GuardBuilder).super__Object._vptr__Object[1])
                                (guard_builder);
                    }
                  }
                  LOCK();
                  paVar1 = &(this_01->super_GuardBuilder).super__Object.refCount;
                  (paVar1->super___atomic_base<long>)._M_i =
                       (paVar1->super___atomic_base<long>)._M_i + 1;
                  UNLOCK();
                  guard_builder = this_01;
                }
                f_icst = _TPX::find_f_icst(&this->super__TPX,(_Fact *)local_50,&local_82,&local_38);
                pCVar7 = local_38;
                if (f_icst == (_Fact *)0x0) {
                  bVar4 = build_mdl(this,(_Fact *)local_50,(_Fact *)local_70,
                                    &guard_builder->super_GuardBuilder,(uint64_t)in_R8);
                  if (bVar4) {
                    _TPX::inject_hlps(&this->super__TPX,local_68);
                  }
                }
                else {
                  pCVar12 = local_38;
                  if (local_38 == (Code *)0x0) {
                    iVar6 = (*(f_icst->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>
                              .super_LObject.super_Code.super__Object._vptr__Object[9])(f_icst,0);
                    plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x48))
                                                ((long *)CONCAT44(extraout_var_00,iVar6),0);
                    sVar5 = (**(code **)(*plVar11 + 0x50))(plVar11);
                    pCVar12 = (Code *)(**(code **)(*plVar11 + 0x48))(plVar11,sVar5 + -1);
                  }
                  iVar6 = (*(pCVar12->super__Object)._vptr__Object[9])(pCVar12,(ulong)local_82);
                  in_R8 = guard_builder;
                  bVar4 = build_mdl(this,f_icst,(_Fact *)CONCAT44(extraout_var_01,iVar6),
                                    (_Fact *)local_70,&guard_builder->super_GuardBuilder,in_R9,
                                    pCVar7);
                  if (bVar4) {
                    _TPX::inject_hlps(&this->super__TPX,local_68);
                  }
                }
              }
              if (local_50 != (_Object *)0x0) {
                LOCK();
                (local_50->refCount).super___atomic_base<long> =
                     (__atomic_base<long>)
                     (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i + -1);
                UNLOCK();
                if (((__int_type)(local_50->refCount).super___atomic_base<long>)._M_i < 1) {
                  (*local_50->_vptr__Object[1])();
                }
              }
              if (local_58 != (_Object *)0x0) {
                LOCK();
                (local_58->refCount).super___atomic_base<long>._M_i =
                     (local_58->refCount).super___atomic_base<long>._M_i + -1;
                UNLOCK();
                if ((local_58->refCount).super___atomic_base<long>._M_i < 1) {
                  (*local_58->_vptr__Object[1])();
                }
              }
              if (local_60 != (long *)0x0) {
                LOCK();
                local_60[1] = local_60[1] + -1;
                UNLOCK();
                if (local_60[1] < 1) {
                  (**(code **)(*local_60 + 8))();
                }
              }
            }
            lVar8 = (destination->cells).
                    super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar8].next;
          } while (lVar8 != -1);
        }
        if (guard_builder != (TimingGuardBuilder *)0x0) {
          LOCK();
          paVar1 = &(guard_builder->super_GuardBuilder).super__Object.refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if ((guard_builder->super_GuardBuilder).super__Object.refCount.super___atomic_base<long>.
              _M_i < 1) {
            (*(guard_builder->super_GuardBuilder).super__Object._vptr__Object[1])(guard_builder);
          }
        }
        if (local_80 != (Code *)0x0) {
          LOCK();
          paVar1 = &(local_80->super__Object).refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if ((local_80->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
            (*(local_80->super__Object)._vptr__Object[1])();
          }
        }
        LOCK();
        paVar1 = &(local_78->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((local_78->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
          (*(local_78->super__Object)._vptr__Object[1])();
        }
        return;
      }
      p_Var2 = (destination->cells).
               super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar8].data.input.object;
      (*p_Var2->_vptr__Object[4])(p_Var2,0);
      sVar5 = r_code::Atom::asOpcode();
      pcVar3 = (destination->cells).
               super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar5 != Opcodes::Cmd) break;
      lVar13 = pcVar3[lVar8].next;
LAB_001930ec:
      r_code::list<r_exec::Input>::__erase(destination,lVar8);
      lVar8 = lVar13;
    }
    bVar4 = BindingMap::intersect(this_00,*(BindingMap **)&pcVar3[lVar8].data.bindings);
    if (!bVar4) {
LAB_001930e4:
      lVar13 = (destination->cells).
               super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar8].next;
      goto LAB_001930ec;
    }
    uVar9 = _Fact::get_after((_Fact *)(destination->cells).
                                      super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar8].data.input.
                                      object);
    uVar10 = _Fact::get_after((_Fact *)local_70);
    if (uVar10 <= uVar9) goto LAB_001930e4;
    lVar8 = (destination->cells).
            super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar8].next;
  } while( true );
}

Assistant:

void PTPX::reduce(r_exec::View *input)
{
    auto_focus->copy_cross_buffer(inputs); // the cause of the prediction failure comes before the prediction.
    uint64_t analysis_starting_time = Now();
    _Fact *consequent = new Fact((Fact *)f_imdl); // input->object is the prediction failure: ignore and consider |f->imdl instead.
    consequent->set_opposite();
    P<BindingMap> end_bm = new BindingMap();
    P<_Fact> abstract_input = (_Fact *)end_bm->abstract_object(consequent, false);
    r_code::list<Input>::const_iterator i;

    for (i = inputs.begin(); i != inputs.end();) { // filter out inputs irrelevant for the prediction.
        if (i->input->code(0).asOpcode() == Opcodes::Cmd) { // no cmds as req lhs (because no bwd-operational); prefer: cmd->effect, effect->imdl.
            i = inputs.erase(i);
        } else if (!end_bm->intersect(i->bindings) || // discard inputs that do not share values with the consequent.
                   i->input->get_after() >= consequent->get_after()) { // discard inputs younger than the consequent.
            i = inputs.erase(i);
        } else {
            ++i;
        }
    }

    P<GuardBuilder> guard_builder;
    uint64_t period;

    for (i = inputs.begin(); i != inputs.end(); ++i) {
        if (i->input->get_reference(0)->code(0).asOpcode() == Opcodes::ICst) {
            continue;    // components will be evaluated first, then the icst will be identified.
        }

        Input cause = *i;

        if (!cause.eligible_cause) {
            continue;
        }

        period = consequent->get_after() - cause.input->get_after();
        guard_builder = new TimingGuardBuilder(period); // TODO: use the durations.
        uint16_t cause_index;
        Code *new_cst;
        _Fact *f_icst = find_f_icst(cause.input, cause_index, new_cst);

        if (f_icst == nullptr) {
            if (build_mdl(cause.input, consequent, guard_builder, period)) {
                inject_hlps(analysis_starting_time);
            }
        } else {
            Code *unpacked_cst;

            if (new_cst == nullptr) {
                Code *cst = f_icst->get_reference(0)->get_reference(0);
                unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
            } else {
                unpacked_cst = new_cst;
            }

            _Fact *cause_pattern = (_Fact *)unpacked_cst->get_reference(cause_index);

            if (build_mdl(f_icst, cause_pattern, consequent, guard_builder, period, new_cst)) {
                inject_hlps(analysis_starting_time);
            }
        }
    }
}